

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_PanAndZoomWidget.cpp
# Opt level: O1

void PanAndZoomWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  void **ppvVar4;
  int iVar5;
  void *local_28;
  void **local_20;
  void *local_18;
  undefined1 *puStack_10;
  
  puStack_10 = (undefined1 *)&local_28;
  ppvVar4 = &local_28;
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == onScaleUpdated && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == onTranslationUpdated && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == onRotationUpdated && lVar3 == 0) {
      *puVar1 = 2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 2) {
      local_28 = *_a[1];
      ppvVar4 = &local_18;
      local_18 = (void *)0x0;
      iVar5 = 2;
    }
    else if (_id == 1) {
      local_18 = *_a[1];
      puStack_10 = *(undefined1 **)((long)_a[1] + 8);
      local_20 = &local_18;
      local_28 = (void *)0x0;
      iVar5 = 1;
    }
    else {
      if (_id != 0) {
        return;
      }
      local_28 = *_a[1];
      ppvVar4 = &local_18;
      local_18 = (void *)0x0;
      iVar5 = 0;
      puStack_10 = (undefined1 *)&local_28;
    }
    QMetaObject::activate(_o,&staticMetaObject,iVar5,ppvVar4);
  }
  return;
}

Assistant:

void PanAndZoomWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PanAndZoomWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->onScaleUpdated((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->onTranslationUpdated((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 2: _t->onRotationUpdated((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PanAndZoomWidget::*)(qreal );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PanAndZoomWidget::onScaleUpdated)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (PanAndZoomWidget::*)(QPointF );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PanAndZoomWidget::onTranslationUpdated)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (PanAndZoomWidget::*)(qreal );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PanAndZoomWidget::onRotationUpdated)) {
                *result = 2;
                return;
            }
        }
    }
}